

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int ngram_model_write(ngram_model_t *model,char *file_name,ngram_file_type_t file_type)

{
  ngram_file_type_t local_24;
  ngram_file_type_t file_type_local;
  char *file_name_local;
  ngram_model_t *model_local;
  
  if (file_type == NGRAM_AUTO) {
    local_24 = ngram_file_name_to_type(file_name);
    if (local_24 == NGRAM_INVALID) {
      local_24 = NGRAM_ARPA;
    }
    model_local._4_4_ = ngram_model_write(model,file_name,local_24);
  }
  else if (file_type == NGRAM_ARPA) {
    model_local._4_4_ = ngram_model_trie_write_arpa(model,file_name);
  }
  else if (file_type == NGRAM_BIN) {
    model_local._4_4_ = ngram_model_trie_write_bin(model,file_name);
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0xc2,"language model file type not supported\n");
    model_local._4_4_ = -1;
  }
  return model_local._4_4_;
}

Assistant:

int
ngram_model_write(ngram_model_t * model, const char *file_name,
                  ngram_file_type_t file_type)
{
    switch (file_type) {
    case NGRAM_AUTO:{
            file_type = ngram_file_name_to_type(file_name);
            /* Default to ARPA (catches .lm and other things) */
            if (file_type == NGRAM_INVALID)
                file_type = NGRAM_ARPA;
            return ngram_model_write(model, file_name, file_type);
        }
    case NGRAM_ARPA:
        return ngram_model_trie_write_arpa(model, file_name);
    case NGRAM_BIN:
        return ngram_model_trie_write_bin(model, file_name);
    default:
        E_ERROR("language model file type not supported\n");
        return -1;
    }
    E_ERROR("language model file type not supported\n");
    return -1;
}